

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandClockGate(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Cgt_Par_t *p;
  int iVar1;
  uint uVar2;
  Io_FileType_t FileType;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pCare;
  char *pcVar3;
  int c;
  Abc_Ntk_t *pNtkCare;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtkRes;
  Cgt_Par_t *pPars;
  uint local_48;
  Cgt_Par_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  p = (Cgt_Par_t *)((long)&pPars + 4);
  Pars._28_8_ = argv;
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  Cgt_SetDefaultParams(p);
  Extra_UtilGetoptReset();
LAB_0028b25b:
  do {
    iVar1 = Extra_UtilGetopt(argc,(char **)Pars._28_8_,"LNDCVKavwh");
    if (iVar1 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      if (argc == globalUtilOptind + 1) {
        pcVar3 = *(char **)(Pars._28_8_ + (long)globalUtilOptind * 8);
        FileType = Io_ReadFileType(*(char **)(Pars._28_8_ + (long)globalUtilOptind * 8));
        pCare = Io_Read(pcVar3,FileType,1,0);
        if (pCare == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Reading care network has failed.\n");
          return 1;
        }
        pNtk = Abc_NtkDarClockGate(pNtk_00,pCare,p);
        Abc_NtkDelete(pCare);
      }
      else {
        if (argc != globalUtilOptind) {
          Abc_Print(-1,"Wrong number of arguments.\n");
          return 0;
        }
        pNtk = Abc_NtkDarClockGate(pNtk_00,(Abc_Ntk_t *)0x0,p);
      }
      if (pNtk == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Clock gating has failed.\n");
        return 0;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
      return 0;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_0028b6bf;
      }
      Pars.nCandMax = atoi(*(char **)(Pars._28_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nCandMax;
      break;
    case 0x44:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        goto LAB_0028b6bf;
      }
      Pars.nLevelMax = atoi(*(char **)(Pars._28_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nLevelMax;
      break;
    default:
      goto LAB_0028b6bf;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
        goto LAB_0028b6bf;
      }
      Pars.nConfMax = atoi(*(char **)(Pars._28_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nConfMax;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_0028b6bf;
      }
      pPars._4_4_ = atoi(*(char **)(Pars._28_8_ + (long)globalUtilOptind * 8));
      uVar2 = pPars._4_4_;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_0028b6bf;
      }
      local_48 = atoi(*(char **)(Pars._28_8_ + (long)globalUtilOptind * 8));
      uVar2 = local_48;
      break;
    case 0x56:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-V\" should be followed by an integer.\n");
        goto LAB_0028b6bf;
      }
      Pars.nOdcMax = atoi(*(char **)(Pars._28_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nOdcMax;
      break;
    case 0x61:
      Pars.nVarsMin = Pars.nVarsMin ^ 1;
      goto LAB_0028b25b;
    case 0x68:
      goto LAB_0028b6bf;
    case 0x76:
      Pars.nFlopsMin = Pars.nFlopsMin ^ 1;
      goto LAB_0028b25b;
    case 0x77:
      Pars.fAreaOnly = Pars.fAreaOnly ^ 1;
      goto LAB_0028b25b;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 1) {
LAB_0028b6bf:
      Abc_Print(-2,"usage: clockgate [-LNDCVK <num>] [-avwh] <file>\n");
      Abc_Print(-2,"\t         sequential clock gating with observability don\'t-cares\n");
      Abc_Print(-2,"\t-L num : max level number of a clock gate [default = %d]\n",(ulong)pPars._4_4_
               );
      Abc_Print(-2,"\t-N num : max number of candidates for a flop [default = %d]\n",(ulong)local_48
               );
      Abc_Print(-2,"\t-D num : max number of ODC levels to consider [default = %d]\n",
                (ulong)(uint)Pars.nLevelMax);
      Abc_Print(-2,"\t-C num : max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)Pars.nCandMax);
      Abc_Print(-2,"\t-V num : min number of vars to recycle SAT solver [default = %d]\n",
                (ulong)(uint)Pars.nOdcMax);
      Abc_Print(-2,"\t-K num : min number of flops to recycle SAT solver [default = %d]\n",
                (ulong)(uint)Pars.nConfMax);
      pcVar3 = "no";
      if (Pars.nVarsMin != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-a     : toggle minimizing area-only [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.nFlopsMin != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fAreaOnly != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-w     : toggle even more detailed output [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\tfile   : (optional) constraints for primary inputs and register outputs\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandClockGate( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cgt_Par_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkRes, * pNtk, * pNtkCare;
    int c;

    extern Abc_Ntk_t * Abc_NtkDarClockGate( Abc_Ntk_t * pNtk, Abc_Ntk_t * pCare, Cgt_Par_t * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Cgt_SetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "LNDCVKavwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLevelMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLevelMax <= 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nCandMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCandMax <= 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nOdcMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nOdcMax <= 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfMax <= 0 )
                goto usage;
            break;
        case 'V':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-V\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nVarsMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVarsMin <= 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFlopsMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFlopsMin <= 0 )
                goto usage;
            break;
        case 'a':
            pPars->fAreaOnly ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( argc == globalUtilOptind + 1 )
    {
        pNtkCare = Io_Read( argv[globalUtilOptind], Io_ReadFileType(argv[globalUtilOptind]), 1, 0 );
        if ( pNtkCare == NULL )
        {
            Abc_Print( -1, "Reading care network has failed.\n" );
            return 1;
        }
        // modify the current network
        pNtkRes = Abc_NtkDarClockGate( pNtk, pNtkCare, pPars );
        Abc_NtkDelete( pNtkCare );
    }
    else if ( argc == globalUtilOptind )
    {
        pNtkRes = Abc_NtkDarClockGate( pNtk, NULL, pPars );
    }
    else
    {
        Abc_Print( -1, "Wrong number of arguments.\n" );
        return 0;
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Clock gating has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: clockgate [-LNDCVK <num>] [-avwh] <file>\n" );
    Abc_Print( -2, "\t         sequential clock gating with observability don't-cares\n" );
    Abc_Print( -2, "\t-L num : max level number of a clock gate [default = %d]\n", pPars->nLevelMax );
    Abc_Print( -2, "\t-N num : max number of candidates for a flop [default = %d]\n", pPars->nCandMax );
    Abc_Print( -2, "\t-D num : max number of ODC levels to consider [default = %d]\n", pPars->nOdcMax );
    Abc_Print( -2, "\t-C num : max number of conflicts at a node [default = %d]\n", pPars->nConfMax );
    Abc_Print( -2, "\t-V num : min number of vars to recycle SAT solver [default = %d]\n", pPars->nVarsMin );
    Abc_Print( -2, "\t-K num : min number of flops to recycle SAT solver [default = %d]\n", pPars->nFlopsMin );
    Abc_Print( -2, "\t-a     : toggle minimizing area-only [default = %s]\n", pPars->fAreaOnly? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle even more detailed output [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tfile   : (optional) constraints for primary inputs and register outputs\n");
    return 1;
}